

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O1

int SUNLinSolSetup_SPTFQMR(SUNLinearSolver S,SUNMatrix A)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  
  pcVar1 = *(code **)((long)S->content + 0x30);
  iVar3 = 0;
  if (pcVar1 != (code *)0x0) {
    iVar2 = (*pcVar1)(*(undefined8 *)((long)S->content + 0x40));
    iVar3 = 0;
    if ((iVar2 != 0) && (iVar3 = 0x324, iVar2 < 0)) {
      iVar3 = -0x326;
    }
  }
  *(int *)((long)S->content + 0x18) = iVar3;
  return iVar3;
}

Assistant:

int SUNLinSolSetup_SPTFQMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A)
{
  SUNFunctionBegin(S->sunctx);

  int status = SUN_SUCCESS;
  SUNPSetupFn Psetup;
  void* PData;

  /* Set shortcuts to SPTFQMR memory structures */
  Psetup = SPTFQMR_CONTENT(S)->Psetup;
  PData  = SPTFQMR_CONTENT(S)->PData;

  /* no solver-specific setup is required, but if user-supplied
     Psetup routine exists, call that here */
  if (Psetup != NULL)
  {
    status = Psetup(PData);
    if (status != 0)
    {
      LASTFLAG(S) = (status < 0) ? SUNLS_PSET_FAIL_UNREC : SUNLS_PSET_FAIL_REC;
      return (LASTFLAG(S));
    }
  }

  /* return with success */
  LASTFLAG(S) = SUN_SUCCESS;
  return SUN_SUCCESS;
}